

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.h
# Opt level: O0

bool __thiscall libmatroska::DataBuffer::FreeBuffer(DataBuffer *this,DataBuffer *aBuffer)

{
  bool local_19;
  bool bResult;
  DataBuffer *aBuffer_local;
  DataBuffer *this_local;
  
  local_19 = true;
  if ((this->myBuffer != (binary *)0x0) && ((this->bValidValue & 1U) != 0)) {
    if (this->myFreeBuffer != (_func_bool_DataBuffer_ptr *)0x0) {
      local_19 = (*this->myFreeBuffer)(aBuffer);
    }
    if (((this->bInternalBuffer & 1U) != 0) && (this->myBuffer != (binary *)0x0)) {
      operator_delete__(this->myBuffer);
    }
    this->myBuffer = (binary *)0x0;
    this->mySize = 0;
    this->bValidValue = false;
  }
  return local_19;
}

Assistant:

bool    FreeBuffer(const DataBuffer & aBuffer) {
      bool bResult = true;
      if (myBuffer != NULL && bValidValue) {
        if (myFreeBuffer != NULL)
          bResult = myFreeBuffer(aBuffer);
        if (bInternalBuffer)
          delete [] myBuffer;
        myBuffer = NULL;
        mySize = 0;
        bValidValue = false;
      }
      return bResult;
    }